

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O3

int Abc_NtkCollapseReduce(Vec_Str_t *vSop,Vec_Int_t *vSupp,Vec_Int_t *vClass,Vec_Wec_t *vSupps)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  void *__s;
  long lVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  
  if (vSop->nSize == 4) {
    if (vClass->nSize < 1) {
      return 1;
    }
    piVar4 = vClass->pArray;
    lVar9 = 0;
    while( true ) {
      iVar10 = piVar4[lVar9];
      if (((long)iVar10 < 0) || (vSupps->nSize <= iVar10)) break;
      vSupps->pArray[iVar10].nSize = 0;
      lVar9 = lVar9 + 1;
      if (vClass->nSize <= lVar9) {
        return 1;
      }
    }
LAB_002a25e1:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  uVar3 = vSupp->nSize;
  uVar16 = (ulong)uVar3;
  pcVar17 = vSop->pArray;
  uVar8 = 0x10;
  if (0xe < uVar3 - 1) {
    uVar8 = uVar3;
  }
  if ((uVar8 == 0) || (__s = malloc((long)(int)uVar8 << 2), __s == (void *)0x0)) {
    __s = (void *)0x0;
  }
  else {
    memset(__s,0,(long)(int)uVar3 * 4);
  }
  cVar2 = *pcVar17;
  if (cVar2 != '\0') {
    lVar9 = (long)(int)uVar3 + 3;
    pcVar11 = pcVar17;
    do {
      if (0 < (int)uVar3) {
        uVar12 = 0;
        do {
          if (pcVar11[uVar12] != '-') {
            if (uVar16 <= uVar12) goto LAB_002a25a3;
            *(undefined4 *)((long)__s + uVar12 * 4) = 1;
          }
          uVar12 = uVar12 + 1;
        } while (uVar16 != uVar12);
      }
      pcVar1 = pcVar11 + lVar9;
      pcVar11 = pcVar11 + lVar9;
    } while (*pcVar1 != '\0');
  }
  if ((int)uVar3 < 1) {
    iVar10 = 0;
  }
  else {
    uVar12 = 0;
    iVar10 = 0;
    do {
      iVar10 = iVar10 + (uint)(*(int *)((long)__s + uVar12 * 4) == 0);
      uVar12 = uVar12 + 1;
    } while (uVar16 != uVar12);
    if (iVar10 == 0) {
      iVar10 = 0;
      goto LAB_002a256b;
    }
    if (cVar2 == '\0') {
      uVar8 = 0;
      iVar10 = 1;
    }
    else {
      uVar7 = uVar3 + 3;
      uVar12 = 1;
      if (1 < (int)uVar7) {
        uVar12 = (ulong)uVar7;
      }
      uVar8 = 0;
      do {
        uVar13 = 0;
        do {
          if ((uVar16 <= uVar13) || (*(int *)((long)__s + uVar13 * 4) != 0)) {
            if (((int)uVar8 < 0) || (vSop->nSize <= (int)uVar8)) goto LAB_002a2584;
            uVar15 = (ulong)uVar8;
            uVar8 = uVar8 + 1;
            vSop->pArray[uVar15] = pcVar17[uVar13];
          }
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
        pcVar11 = pcVar17 + (int)uVar7;
        pcVar17 = pcVar17 + (int)uVar7;
      } while (*pcVar11 != '\0');
      if ((int)uVar8 < 0) goto LAB_002a2584;
      iVar10 = uVar8 + 1;
    }
    if (vSop->nSize <= (int)uVar8) {
LAB_002a2584:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                    ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
    }
    vSop->pArray[uVar8] = '\0';
    if (vSop->nSize <= (int)uVar8) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                    ,0x20a,"void Vec_StrShrink(Vec_Str_t *, int)");
    }
    vSop->nSize = iVar10;
    if (0 < vClass->nSize) {
      piVar4 = vClass->pArray;
      lVar9 = 0;
      do {
        lVar14 = (long)piVar4[lVar9];
        if ((lVar14 < 0) || (vSupps->nSize <= piVar4[lVar9])) goto LAB_002a25e1;
        pVVar5 = vSupps->pArray;
        uVar8 = pVVar5[lVar14].nSize;
        if ((int)uVar8 < 1) {
          uVar7 = 0;
        }
        else {
          piVar6 = pVVar5[lVar14].pArray;
          uVar16 = 0;
          uVar7 = 0;
          do {
            if (uVar3 == uVar16) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (*(int *)((long)__s + uVar16 * 4) != 0) {
              if (((int)uVar7 < 0) || (uVar8 <= uVar7)) {
LAB_002a25a3:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              uVar12 = (ulong)uVar7;
              uVar7 = uVar7 + 1;
              piVar6[uVar12] = piVar6[uVar16];
              uVar8 = pVVar5[lVar14].nSize;
            }
            uVar16 = uVar16 + 1;
          } while ((long)uVar16 < (long)(int)uVar8);
        }
        if ((int)uVar8 < (int)uVar7) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        pVVar5[lVar14].nSize = uVar7;
        lVar9 = lVar9 + 1;
      } while (lVar9 < vClass->nSize);
    }
    iVar10 = 1;
  }
  if (__s == (void *)0x0) {
    return iVar10;
  }
LAB_002a256b:
  free(__s);
  return iVar10;
}

Assistant:

int Abc_NtkCollapseReduce( Vec_Str_t * vSop, Vec_Int_t * vSupp, Vec_Int_t * vClass, Vec_Wec_t * vSupps )
{
    int j = 0, i, k, iCo, iVar, nVars = Vec_IntSize(vSupp);
    char * pCube, * pSop = Vec_StrArray(vSop);
    Vec_Int_t * vPres;
    if ( Vec_StrSize(vSop) == 4 ) // constant
    {
        Vec_IntForEachEntry( vClass, iCo, i )
            Vec_IntClear( Vec_WecEntry(vSupps, iCo) );
        return 1;
    }
    vPres = Vec_IntStart( nVars );
    Abc_NtkSopForEachCube( pSop, nVars, pCube )
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntWriteEntry( vPres, k, 1 );
    if ( Vec_IntCountZero(vPres) == 0 )
    {
        Vec_IntFree( vPres );
        return 0;
    }
    // reduce cubes
    Abc_NtkSopForEachCube( pSop, nVars, pCube )
        for ( k = 0; k < nVars + 3; k++ )
            if ( k >= nVars || Vec_IntEntry(vPres, k) )
                Vec_StrWriteEntry( vSop, j++, pCube[k] );
    Vec_StrWriteEntry( vSop, j++, '\0' );
    Vec_StrShrink( vSop, j );
    // reduce support
    Vec_IntForEachEntry( vClass, iCo, i )
    {
        j = 0;
        vSupp = Vec_WecEntry( vSupps, iCo );
        Vec_IntForEachEntry( vSupp, iVar, k )
            if ( Vec_IntEntry(vPres, k) )
                Vec_IntWriteEntry( vSupp, j++, iVar );
        Vec_IntShrink( vSupp, j );
    }
    Vec_IntFree( vPres );
//    if ( Vec_IntSize(vSupp) != Abc_SopGetVarNum(Vec_StrArray(vSop)) )
//        printf( "Mismatch!!!\n" );
    return 1;
}